

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::~AnyWriter(AnyWriter *this)

{
  pointer pcVar1;
  ProtoStreamObjectWriter *pPVar2;
  
  std::
  vector<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
  ::~vector(&this->uninterpreted_events_);
  pcVar1 = (this->data_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->data_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->type_url_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->type_url_).field_2) {
    operator_delete(pcVar1);
  }
  pPVar2 = (this->ow_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
           ._M_head_impl;
  if (pPVar2 != (ProtoStreamObjectWriter *)0x0) {
    (**(code **)(*(long *)&(pPVar2->super_ProtoWriter).super_StructuredObjectWriter + 8))();
  }
  (this->ow_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
  _M_head_impl = (ProtoStreamObjectWriter *)0x0;
  return;
}

Assistant:

ProtoStreamObjectWriter::AnyWriter::~AnyWriter() {}